

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapperCut.c
# Opt level: O3

int Map_CutMergeTwo(Map_Cut_t *pCut1,Map_Cut_t *pCut2,Map_Node_t **ppNodes,int nNodesMax)

{
  char cVar1;
  char cVar2;
  Map_Node_t *pMVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  bool bVar14;
  
  uVar6 = (ulong)(uint)nNodesMax;
  cVar1 = pCut1->nLeaves;
  uVar5 = (uint)cVar1;
  if (uVar5 == nNodesMax) {
    cVar2 = pCut2->nLeaves;
    uVar8 = (uint)cVar2;
    if (uVar8 == nNodesMax) {
      if (nNodesMax < 1) {
        return nNodesMax;
      }
      uVar7 = 0;
      while (pCut1->ppLeaves[uVar7] == pCut2->ppLeaves[uVar7]) {
        uVar7 = uVar7 + 1;
        if (uVar6 == uVar7) {
          if (0 < nNodesMax) {
            uVar7 = 0;
            do {
              ppNodes[uVar7] = pCut1->ppLeaves[uVar7];
              uVar7 = uVar7 + 1;
            } while (uVar6 != uVar7);
            return nNodesMax;
          }
          return nNodesMax;
        }
      }
    }
    else {
      if (nNodesMax - 1U != uVar8) goto LAB_003d4f95;
      if (nNodesMax < 1) {
        return nNodesMax;
      }
      uVar7 = 0;
      iVar9 = 0;
      while ((pCut1->ppLeaves[uVar7] ==
              *(Map_Node_t **)((long)pCut2 + uVar7 * 8 + (long)iVar9 * -8 + 0x18) ||
             (bVar14 = iVar9 != 1, iVar9 = 1, bVar14))) {
        uVar7 = uVar7 + 1;
        if (uVar6 == uVar7) {
          if (0 < nNodesMax) {
            uVar7 = 0;
            do {
              ppNodes[uVar7] = pCut1->ppLeaves[uVar7];
              uVar7 = uVar7 + 1;
            } while (uVar6 != uVar7);
            return nNodesMax;
          }
          return nNodesMax;
        }
      }
    }
  }
  else {
    cVar2 = pCut2->nLeaves;
    uVar8 = (uint)cVar2;
    if (uVar8 != nNodesMax || nNodesMax - 1U != uVar5) {
LAB_003d4f95:
      uVar6 = (ulong)uVar5;
      if ('\0' < cVar2) {
        uVar7 = 0;
        do {
          if ('\0' < cVar1) {
            uVar12 = 0;
            do {
              if (pCut2->ppLeaves[uVar7] == pCut1->ppLeaves[uVar12]) goto LAB_003d4fdc;
              uVar12 = uVar12 + 1;
            } while (uVar6 != uVar12);
          }
          if (uVar5 == nNodesMax) {
            return 0;
          }
          lVar13 = (long)(int)uVar5;
          uVar5 = uVar5 + 1;
          ppNodes[lVar13] = pCut2->ppLeaves[uVar7];
LAB_003d4fdc:
          uVar7 = uVar7 + 1;
        } while (uVar7 != uVar8);
      }
      if ('\0' < cVar1) {
        uVar7 = 0;
        do {
          ppNodes[uVar7] = pCut1->ppLeaves[uVar7];
          uVar7 = uVar7 + 1;
        } while (uVar6 != uVar7);
      }
      if (1 < (int)uVar5) {
        uVar7 = 1;
        uVar6 = 0;
        do {
          uVar12 = uVar6 + 1;
          uVar11 = uVar6 & 0xffffffff;
          uVar10 = uVar7;
          do {
            uVar4 = uVar10 & 0xffffffff;
            if (ppNodes[(int)uVar11]->Num <= ppNodes[uVar10]->Num) {
              uVar4 = uVar11;
            }
            uVar11 = uVar4;
            uVar10 = uVar10 + 1;
          } while (uVar5 != uVar10);
          pMVar3 = ppNodes[uVar6];
          ppNodes[uVar6] = ppNodes[(int)uVar11];
          ppNodes[(int)uVar11] = pMVar3;
          uVar7 = uVar7 + 1;
          uVar6 = uVar12;
        } while (uVar12 != uVar5 - 1);
      }
      return uVar5;
    }
    if (nNodesMax < 1) {
      return nNodesMax;
    }
    uVar7 = 0;
    iVar9 = 0;
    while ((*(Map_Node_t **)((long)pCut1 + uVar7 * 8 + (long)iVar9 * -8 + 0x18) ==
            pCut2->ppLeaves[uVar7] || (bVar14 = iVar9 != 1, iVar9 = 1, bVar14))) {
      uVar7 = uVar7 + 1;
      if (uVar6 == uVar7) {
        if (0 < nNodesMax) {
          uVar7 = 0;
          do {
            ppNodes[uVar7] = pCut2->ppLeaves[uVar7];
            uVar7 = uVar7 + 1;
          } while (uVar6 != uVar7);
          return nNodesMax;
        }
        return nNodesMax;
      }
    }
  }
  return 0;
}

Assistant:

int Map_CutMergeTwo( Map_Cut_t * pCut1, Map_Cut_t * pCut2, Map_Node_t * ppNodes[], int nNodesMax )
{
    Map_Node_t * pNodeTemp;
    int nTotal, i, k, min, fMismatch;

    // check the special case when at least of the cuts is the largest
    if ( pCut1->nLeaves == nNodesMax )
    {
        if ( pCut2->nLeaves == nNodesMax )
        {
            // return 0 if the cuts are different
            for ( i = 0; i < nNodesMax; i++ )
                if ( pCut1->ppLeaves[i] != pCut2->ppLeaves[i] )
                    return 0;
            // return nNodesMax if they are the same
            for ( i = 0; i < nNodesMax; i++ )
                ppNodes[i] = pCut1->ppLeaves[i];
            return nNodesMax;
        }
        else if ( pCut2->nLeaves == nNodesMax - 1 ) 
        {
            // return 0 if the cuts are different
            fMismatch = 0;
            for ( i = 0; i < nNodesMax; i++ )
                if ( pCut1->ppLeaves[i] != pCut2->ppLeaves[i - fMismatch] )
                {
                    if ( fMismatch == 1 )
                        return 0;
                    fMismatch = 1;
                }
            // return nNodesMax if they are the same
            for ( i = 0; i < nNodesMax; i++ )
                ppNodes[i] = pCut1->ppLeaves[i];
            return nNodesMax;
        }
    }
    else if ( pCut1->nLeaves == nNodesMax - 1 && pCut2->nLeaves == nNodesMax )
    {
        // return 0 if the cuts are different
        fMismatch = 0;
        for ( i = 0; i < nNodesMax; i++ )
            if ( pCut1->ppLeaves[i - fMismatch] != pCut2->ppLeaves[i] )
            {
                if ( fMismatch == 1 )
                    return 0;
                fMismatch = 1;
            }
        // return nNodesMax if they are the same
        for ( i = 0; i < nNodesMax; i++ )
            ppNodes[i] = pCut2->ppLeaves[i];
        return nNodesMax;
    }

    // count the number of unique entries in pCut2
    nTotal = pCut1->nLeaves;
    for ( i = 0; i < pCut2->nLeaves; i++ )
    {
        // try to find this entry among the leaves of pCut1
        for ( k = 0; k < pCut1->nLeaves; k++ )
            if ( pCut2->ppLeaves[i] == pCut1->ppLeaves[k] )
                break;
        if ( k < pCut1->nLeaves ) // found
            continue;
        // we found a new entry to add
        if ( nTotal == nNodesMax )
            return 0;
        ppNodes[nTotal++] = pCut2->ppLeaves[i];
    }
    // we know that the feasible cut exists

    // add the starting entries
    for ( k = 0; k < pCut1->nLeaves; k++ )
        ppNodes[k] = pCut1->ppLeaves[k];

    // selection-sort the entries
    for ( i = 0; i < nTotal - 1; i++ )
    {
        min = i;
        for ( k = i+1; k < nTotal; k++ )
//            if ( ppNodes[k] < ppNodes[min] ) // reported bug fix (non-determinism!)
            if ( ppNodes[k]->Num < ppNodes[min]->Num )
                min = k;
        pNodeTemp    = ppNodes[i];
        ppNodes[i]   = ppNodes[min];
        ppNodes[min] = pNodeTemp;
    }

    return nTotal;
}